

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O0

void quicly_rtt_update(quicly_rtt_t *rtt,uint32_t latest_rtt,uint32_t ack_delay)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  uint *in_RDI;
  uint32_t absdiff;
  int is_first_sample;
  int local_20;
  uint local_1c;
  
  uVar1 = in_RDI[3];
  if (in_ESI == 0xffffffff) {
    __assert_fail("latest_rtt != UINT32_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                  ,0xc6,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
  }
  local_1c = in_ESI;
  if (in_ESI == 0) {
    local_1c = 1;
  }
  in_RDI[3] = local_1c;
  if (in_RDI[3] < *in_RDI) {
    *in_RDI = in_RDI[3];
  }
  if (*in_RDI + in_EDX < in_RDI[3]) {
    in_RDI[3] = in_RDI[3] - in_EDX;
  }
  if (uVar1 == 0) {
    in_RDI[1] = in_RDI[3];
    in_RDI[2] = in_RDI[3] >> 1;
  }
  else {
    if (in_RDI[1] < in_RDI[3]) {
      local_20 = in_RDI[3] - in_RDI[1];
    }
    else {
      local_20 = in_RDI[1] - in_RDI[3];
    }
    in_RDI[2] = in_RDI[2] * 3 + local_20 >> 2;
    in_RDI[1] = in_RDI[1] * 7 + in_RDI[3] >> 3;
  }
  if (in_RDI[1] == 0) {
    __assert_fail("rtt->smoothed != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                  ,0xda,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
  }
  return;
}

Assistant:

inline void quicly_rtt_update(quicly_rtt_t *rtt, uint32_t latest_rtt, uint32_t ack_delay)
{
    int is_first_sample = rtt->latest == 0;

    assert(latest_rtt != UINT32_MAX);
    rtt->latest = latest_rtt != 0 ? latest_rtt : 1; /* Force minimum RTT sample to 1ms */

    /* update min_rtt */
    if (rtt->latest < rtt->minimum)
        rtt->minimum = rtt->latest;

    /* use ack_delay if it's a plausible value */
    if (rtt->latest > rtt->minimum + ack_delay)
        rtt->latest -= ack_delay;

    /* update smoothed_rtt and rttvar */
    if (is_first_sample) {
        rtt->smoothed = rtt->latest;
        rtt->variance = rtt->latest / 2;
    } else {
        uint32_t absdiff = rtt->smoothed >= rtt->latest ? rtt->smoothed - rtt->latest : rtt->latest - rtt->smoothed;
        rtt->variance = (rtt->variance * 3 + absdiff) / 4;
        rtt->smoothed = (rtt->smoothed * 7 + rtt->latest) / 8;
    }
    assert(rtt->smoothed != 0);
}